

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

void __thiscall sophia_interface::LUEXEC(sophia_interface *this)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  double (*padVar10) [4000];
  long lVar11;
  double (*padVar12) [4000];
  sophia_interface *psVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  sophia_interface *local_168 [2];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [40];
  int aiStack_100 [2];
  sophia_interface *local_f8 [2];
  undefined1 local_e8 [16];
  double dStack_d8;
  double PS [6] [2];
  
  PS[4][1] = 0.0;
  PS[5][0] = 0.0;
  PS[3][1] = 0.0;
  PS[4][0] = 0.0;
  PS[2][1] = 0.0;
  PS[3][0] = 0.0;
  PS[1][1] = 0.0;
  PS[2][0] = 0.0;
  PS[0][1] = 0.0;
  PS[1][0] = 0.0;
  dStack_d8 = 0.0;
  PS[0][0] = 0.0;
  MSTU[0x17] = 0;
  psVar13 = this;
  if (0 < MSTU[0xb]) {
    psVar13 = (sophia_interface *)local_168;
    local_168[0] = (sophia_interface *)local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"LULIST(0), Method removed.","");
    LUERRM(psVar13,-1,(string *)local_168);
    psVar13 = local_168[0];
    if (local_168[0] != (sophia_interface *)local_158) {
      operator_delete(local_168[0]);
    }
  }
  MSTU[0x1e] = MSTU[0x1e] + 1;
  MSTU[0] = 0;
  MSTU[1] = 0;
  MSTU[2] = 0;
  if (MSTU[0x10] < 1) {
    MSTU[0x59] = 0;
  }
  iVar9 = this->N;
  dVar1 = 0.0;
  local_128._32_8_ = 0.0;
  dVar2 = 0.0;
  if (0 < iVar9) {
    padVar12 = this->P;
    lVar17 = 0;
    iVar6 = iVar9;
    do {
      if (0xfffffff5 < this->K[0][lVar17] - 0xbU) {
        lVar11 = 0;
        padVar10 = padVar12;
        do {
          *(double *)((long)PS[-1] + lVar11 + 8) =
               (*padVar10)[0] + *(double *)((long)PS[-1] + lVar11 + 8);
          lVar11 = lVar11 + 0x10;
          padVar10 = padVar10 + 1;
        } while (lVar11 != 0x40);
        iVar6 = LUCHGE(psVar13,this->K[1][lVar17]);
        dVar1 = (double)iVar6 + PS[4][1];
        iVar6 = this->N;
        PS[4][1] = dVar1;
      }
      lVar17 = lVar17 + 1;
      padVar12 = (double (*) [4000])(*padVar12 + 1);
      local_128._32_8_ = PS[2][1];
      dVar2 = dVar1;
    } while (lVar17 < iVar6);
  }
  aiStack_100[0] = 0;
  aiStack_100[1] = 0;
  psVar13 = this;
  PARU[0x14] = (double)local_128._32_8_;
  LUPREP(this,0);
  padVar12 = this->P;
  bVar4 = true;
  bVar3 = 1;
  bVar5 = false;
  do {
    lVar17 = 0;
    do {
      lVar11 = lVar17 + 1;
      iVar6 = this->K[0][lVar17];
      if (iVar6 - 1U < 10) {
        iVar14 = this->K[1][lVar17];
        iVar7 = LUCOMP(psVar13,iVar14);
        if (iVar7 != 0) {
          iVar16 = (int)lVar17;
          if (KCHG[0][(long)iVar7 + 499] == 0) {
            if ((0 < MSTJ[0x14]) && (0 < MDCY[-1][(long)iVar7 + 499])) {
              if (0 < MSTJ[0x32] && !bVar5) {
                iVar6 = -iVar14;
                if (0 < iVar14) {
                  iVar6 = iVar14;
                }
                if ((PMAS[0][(long)iVar7 + 499] < PARJ[0x5a]) && (iVar6 != 0x137))
                goto LAB_0010d029;
              }
              psVar13 = this;
              LUDECY(this,iVar16 + 1);
            }
LAB_0010d029:
            iVar6 = MSTJ[0x5b];
            lVar15 = (long)MSTJ[0x5b];
            if (lVar15 < 1) {
              if (MSTJ[0x5b] < 0) {
                iVar6 = -MSTJ[0x5b];
                LUSHOW(this,iVar6,-3,this->P[4][lVar17]);
                psVar13 = this;
                LUPREP(this,iVar6);
                MSTJ[0x5b] = 0;
              }
            }
            else {
              uVar8 = MSTJ[0x5b] - 1;
              dVar1 = this->P[3][uVar8] + this->P[3][lVar15];
              dVar18 = this->P[0][uVar8] + this->P[0][lVar15];
              dVar19 = this->P[1][uVar8] + this->P[1][lVar15];
              dVar20 = this->P[2][uVar8] + this->P[2][lVar15];
              dVar1 = ((dVar1 * dVar1 - dVar18 * dVar18) - dVar19 * dVar19) - dVar20 * dVar20;
              if (dVar1 <= 0.0) {
                dVar1 = 0.0;
              }
              LUSHOW(this,MSTJ[0x5b],MSTJ[0x5b] + 1,SQRT(dVar1));
              psVar13 = this;
              LUPREP(this,iVar6);
              MSTJ[0x5b] = 0;
            }
          }
          else if (iVar6 - 1U < 2) {
            iVar14 = MSTJ[0];
            if (0 < MSTJ[0]) {
              iVar14 = 2;
            }
            if (iVar6 != 1) {
              iVar14 = MSTJ[0];
            }
            if ((((MSTJ[0x14] < 2) || (iVar6 != 2)) || (this->N <= lVar11)) ||
               (((this->K[0][lVar17 + 1] != 1 || (iVar6 = this->K[2][lVar17], lVar17 < iVar6)) ||
                ((iVar7 = this->K[2][lVar17 + 1], iVar7 != iVar6 ||
                 ((iVar6 < 1 ||
                  (iVar6 = LUCOMP(psVar13,this->K[1][iVar7 - 1]), KCHG[0][(long)iVar6 + 499] != 0)))
                 ))))) {
              if (iVar14 == 2) {
                psVar13 = this;
                LUINDF(this,iVar16 + 1);
                if (MSTJ[2] < 1) {
                  bVar4 = false;
                }
                if (this->K[0][lVar17] == 1) {
                  bVar4 = false;
                }
                if ((uint)(MSTJ[2] * -0x33333333) < 0x33333334) {
                  bVar4 = false;
                }
              }
              else if (iVar14 == 1) goto LAB_0010d172;
            }
            else if (0 < iVar14) {
LAB_0010d172:
              psVar13 = this;
              LUSTRF(this,iVar16 + 1);
            }
          }
        }
      }
      if (((MSTU[0x17] != 0) && (1 < MSTU[0x14])) || (this->N <= lVar11)) goto LAB_0010d1d2;
      lVar17 = lVar11;
    } while (this->N < (MSTU[3] - MSTU[0x1f]) + -0x14);
    psVar13 = (sophia_interface *)local_f8;
    local_f8[0] = (sophia_interface *)local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"LUEXEC: no more memory left in LUJETS","");
    LUERRM(psVar13,0xb,(string *)local_f8);
    psVar13 = local_f8[0];
    if (local_f8[0] != (sophia_interface *)local_e8) {
      operator_delete(local_f8[0]);
    }
LAB_0010d1d2:
    if (!(bool)(bVar3 & 0 < MSTJ[0x32])) {
      iVar9 = this->N;
      dVar1 = 0.0;
      if (0 < iVar9) {
        lVar17 = 0;
        dVar1 = 0.0;
        do {
          if (0xfffffff5 < this->K[0][lVar17] - 0xbU) {
            lVar11 = 0;
            padVar10 = padVar12;
            do {
              *(double *)((long)PS[0] + lVar11) = (*padVar10)[0] + *(double *)((long)PS[0] + lVar11)
              ;
              padVar10 = padVar10 + 1;
              lVar11 = lVar11 + 0x10;
            } while (lVar11 != 0x40);
            iVar9 = LUCHGE(psVar13,this->K[1][lVar17]);
            dVar1 = (double)iVar9 + PS[5][0];
            iVar9 = this->N;
            PS[5][0] = dVar1;
          }
          lVar17 = lVar17 + 1;
          padVar12 = (double (*) [4000])(*padVar12 + 1);
        } while (lVar17 < iVar9);
      }
      if (bVar4) {
        if (PARU[10] <
            (ABS(PS[0][0] - dStack_d8) + ABS(PS[1][0] - PS[0][1]) + ABS(PS[2][0] - PS[1][1]) +
            ABS(PS[3][0] - (double)local_128._32_8_)) /
            (ABS(PS[3][0]) + 1.0 + ABS((double)local_128._32_8_))) {
          psVar13 = (sophia_interface *)local_148;
          local_148._0_8_ = local_148 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_148,"LUEXEC: four-momentum was not conserved","");
          LUERRM(psVar13,0xf,(string *)local_148);
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_);
          }
        }
        if (0.1 < ABS(dVar1 - dVar2)) {
          psVar13 = (sophia_interface *)local_128;
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"LUEXEC: charge was not conserved","");
          LUERRM(psVar13,0xf,(string *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_);
          }
        }
      }
      return;
    }
    psVar13 = this;
    LUBOEI(this,iVar9);
    bVar5 = true;
    bVar3 = 0;
  } while( true );
}

Assistant:

void sophia_interface::LUEXEC() {
// Purpose: to administrate the fragmentation and decay chain.
    double PS[6][2] = {0.};

    // Initialize and reset.
    MSTU[23] = 0;
    if (MSTU[11] >= 1) LUERRM(-1, "LULIST(0), Method removed.");
    MSTU[30]++;
    MSTU[0] = 0;
    MSTU[1] = 0;
    MSTU[2] = 0;
    if (MSTU[16] <= 0) MSTU[89] = 0;
    int MCONS = 1;

    // Sum up momentum, energy and charge for starting entries.
    int NSAV = N;
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][0] += P[J][I];
        }
        PS[5][0] += LUCHGE(K[1][I]);
    }
    PARU[20] = PS[3][0];

    // Prepare system for subsequent fragmentation/decay.
    LUPREP(0);

    // Loop through jet fragmentation and particle decays.
    int MBE = 0;
    bool repeat140 = false;
    do {  // 140
        repeat140 = false;
        MBE++;
        int IP = 0;

        bool repeat150 = false;
        do {  // 150
            repeat150 = false;
            IP++;
            int KC = 0;
            if (K[0][IP - 1] > 0 && K[0][IP - 1] <= 10) KC = LUCOMP(K[1][IP - 1]);
            if (KC == 0) {
                // do nothing
            // Particle decay if unstable and allowed. Save long-lived particle
            // decays until second pass after Bose-Einstein effects.
            } else if (KCHG[1][KC - 1] == 0) {
                if (MSTJ[20] >= 1 && MDCY[0][KC - 1] >= 1 && (MSTJ[50] <= 0 || MBE == 2 || PMAS[1][KC - 1] >= PARJ[90] || std::abs(K[1][IP - 1]) == 311)) {
                    LUDECY(IP);
                }

                // Decay products may develop a shower.
                if (MSTJ[91] > 0) {
                    int IP1 = MSTJ[91];
                    double QMAX = std::sqrt(std::max(0., (P[3][IP1 - 1] + P[3][IP1]) * (P[3][IP1 - 1] + P[3][IP1]) - (P[0][IP1 - 1] + P[0][IP1]) * (P[0][IP1 - 1] + P[0][IP1]) - (P[1][IP1 - 1] + P[1][IP1]) * (P[1][IP1 - 1] + P[1][IP1]) - (P[2][IP1 - 1] + P[2][IP1]) * (P[2][IP1 - 1] + P[2][IP1])));
                    LUSHOW(IP1, IP1 + 1, QMAX);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                } else if (MSTJ[91] < 0) {
                    int IP1 = -MSTJ[91];
                    LUSHOW(IP1, -3, P[4][IP - 1]);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                }

            // Jet fragmentation: string or independent fragmentation.
            } else if (K[0][IP - 1] == 1 || K[0][IP - 1] == 2) {
                int MFRAG = MSTJ[0];
                if (MFRAG >= 1 && K[0][IP - 1] == 1) MFRAG = 2;
                if (MSTJ[20] >= 2 && K[0][IP - 1] == 2 && N > IP) {
                    if (K[0][IP] == 1 && K[2][IP] == K[2][IP - 1] && K[2][IP - 1] > 0 && K[2][IP - 1] < IP) {
                        if (KCHG[1][LUCOMP(K[1][K[2][IP - 1] - 1]) - 1] == 0) MFRAG = std::min(1, MFRAG);
                    }
                }

                if (MFRAG == 1) LUSTRF(IP);
                if (MFRAG == 2) LUINDF(IP);

                if (MFRAG == 2 && K[0][IP - 1] == 1) MCONS = 0;
                if (MFRAG == 2 && (MSTJ[2] <= 0 || MSTJ[2] % 5 == 0)) MCONS = 0;
            }

            // Loop back if enough space left in LUJETS and no error abort.
            if (MSTU[23] != 0 && MSTU[20] >= 2) {
                // do nothing
            } else if (IP < N && N < MSTU[3] - 20 - MSTU[31]) {
                repeat150 = true;
                continue;
            } else if (IP < N) {
                LUERRM(11, "LUEXEC: no more memory left in LUJETS");
            }
        } while (repeat150);  // 150

        // Include simple Bose-Einstein effect parametrization if desired.
        if (MBE == 1 && MSTJ[50] >= 1) {
            LUBOEI(NSAV);
            repeat140 = true;
            continue;
        }
    } while (repeat140);  // 140

    // Check that momentum, energy and charge were conserved.
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][1] += P[J][I];
        }
        PS[5][1] += LUCHGE(K[1][I]);
    }
    double PDEV = (std::abs(PS[0][1] - PS[0][0]) + std::abs(PS[1][1] - PS[1][0]) + std::abs(PS[2][1] - PS[2][0]) + std::abs(PS[3][1] - PS[3][0])) / (1. + std::abs(PS[3][1]) + std::abs(PS[3][0]));
    if (MCONS == 1 && PDEV > PARU[10]) LUERRM(15, "LUEXEC: four-momentum was not conserved");
    if (MCONS == 1 && std::abs(PS[5][1] - PS[5][0]) > 0.1) LUERRM(15, "LUEXEC: charge was not conserved");
    return;
}